

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestCaseEnd(StreamingListener *this,TestCase *test_case)

{
  bool bVar1;
  char *pcVar2;
  TimeInMillis local_60;
  String local_58;
  String local_48;
  String local_38 [2];
  TestCase *local_18;
  TestCase *test_case_local;
  StreamingListener *this_local;
  
  local_18 = test_case;
  test_case_local = (TestCase *)this;
  bVar1 = TestCase::Passed(test_case);
  local_60 = TestCase::elapsed_time(local_18);
  StreamableToString<long_long>((internal *)&local_58,&local_60);
  pcVar2 = String::c_str(&local_58);
  String::Format(&local_48,"event=TestCaseEnd&passed=%d&elapsed_time=%sms\n",(ulong)bVar1,pcVar2);
  String::operator_cast_to_string(local_38);
  Send(this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  String::~String((String *)this);
  String::~String((String *)this);
  return;
}

Assistant:

void OnTestCaseEnd(const TestCase& test_case) {
    Send(String::Format("event=TestCaseEnd&passed=%d&elapsed_time=%sms\n",
                        test_case.Passed(),
                        StreamableToString(test_case.elapsed_time()).c_str()));
  }